

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int write_pidfile(char *filename)

{
  __pid_t _Var1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  
  _Var1 = getpid();
  __stream = fopen64(filename,"wb");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    logmsg("Couldn\'t write pid file: %s %s",filename,pcVar3);
  }
  else {
    curl_mfprintf((FILE *)__stream,"%ld\n",(long)_Var1);
    fclose(__stream);
    logmsg("Wrote pid %ld to %s",(long)_Var1,filename);
  }
  return (uint)(__stream != (FILE *)0x0);
}

Assistant:

int write_pidfile(const char *filename)
{
  FILE *pidfile;
  long pid;

  pid = (long)getpid();
  pidfile = fopen(filename, "wb");
  if(!pidfile) {
    logmsg("Couldn't write pid file: %s %s", filename, strerror(ERRNO));
    return 0; /* fail */
  }
  fprintf(pidfile, "%ld\n", pid);
  fclose(pidfile);
  logmsg("Wrote pid %ld to %s", pid, filename);
  return 1; /* success */
}